

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppc.c
# Opt level: O3

target_ulong cpu_ppc_load_decr_ppc(CPUPPCState_conflict *env)

{
  ppc_tb_t *ppVar1;
  uint64_t uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int64_t iVar6;
  target_ulong tVar7;
  ulong uVar8;
  ppc_tb_t *tb_env;
  
  ppVar1 = env->tb_env;
  uVar2 = ppVar1->decr_next;
  iVar6 = qemu_clock_get_ns(QEMU_CLOCK_VIRTUAL);
  uVar8 = uVar2 - iVar6;
  if ((long)uVar8 < 0) {
    tVar7 = 0;
    if ((ppVar1->flags & 1) == 0) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = -uVar8;
      auVar4 = ZEXT416(ppVar1->decr_freq) * auVar4;
      iVar5 = __udivti3(auVar4._0_8_,auVar4._8_8_,1000000000,0);
      tVar7 = (target_ulong)(uint)-iVar5;
    }
  }
  else {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar8;
    auVar3 = ZEXT416(ppVar1->decr_freq) * auVar3;
    tVar7 = __udivti3(auVar3._0_8_,auVar3._8_8_,1000000000,0);
  }
  return tVar7;
}

Assistant:

target_ulong cpu_ppc_load_decr(CPUPPCState *env)
{
    ppc_tb_t *tb_env = env->tb_env;
    uint64_t decr;

#if 0
    if (kvm_enabled()) {
        return env->spr[SPR_DECR];
    }
#endif

    decr = _cpu_ppc_load_decr(env, tb_env->decr_next);

    /*
     * If large decrementer is enabled then the decrementer is signed extened
     * to 64 bits, otherwise it is a 32 bit value.
     */
    if (env->spr[SPR_LPCR] & LPCR_LD) {
        return decr;
    }
    return (uint32_t) decr;
}